

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O0

wchar_t archive_entry_sparse_count(archive_entry *entry)

{
  int64_t iVar1;
  archive_entry *in_RDI;
  wchar_t count;
  ae_sparse *sp;
  archive_entry *entry_00;
  wchar_t local_14;
  ae_sparse *local_10;
  
  local_14 = L'\0';
  for (local_10 = in_RDI->sparse_head; local_10 != (ae_sparse *)0x0; local_10 = local_10->next) {
    local_14 = local_14 + L'\x01';
  }
  if ((local_14 == L'\x01') && (in_RDI->sparse_head->offset == 0)) {
    entry_00 = (archive_entry *)in_RDI->sparse_head->length;
    iVar1 = archive_entry_size(in_RDI);
    if (iVar1 <= (long)entry_00) {
      local_14 = L'\0';
      archive_entry_sparse_clear(entry_00);
    }
  }
  return local_14;
}

Assistant:

int
archive_entry_sparse_count(struct archive_entry *entry)
{
	struct ae_sparse *sp;
	int count = 0;

	for (sp = entry->sparse_head; sp != NULL; sp = sp->next)
		count++;

	/*
	 * Sanity check if this entry is exactly sparse.
	 * If amount of sparse blocks is just one and it indicates the whole
	 * file data, we should remove it and return zero.
	 */
	if (count == 1) {
		sp = entry->sparse_head;
		if (sp->offset == 0 &&
		    sp->length >= archive_entry_size(entry)) {
			count = 0;
			archive_entry_sparse_clear(entry);
		}
	}

	return (count);
}